

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint128.hpp
# Opt level: O0

__uint128_t * pstore::uint128::bytes_to_uint128(__uint128_t *__return_storage_ptr__,uint8_t *bytes)

{
  uint8_t *bytes_local;
  
  return (__uint128_t *)
         ((ulong)*(byte *)((long)__return_storage_ptr__ + 8) << 0x38 |
          (ulong)*(byte *)((long)__return_storage_ptr__ + 9) << 0x30 |
          (ulong)*(byte *)((long)__return_storage_ptr__ + 10) << 0x28 |
          (ulong)*(byte *)((long)__return_storage_ptr__ + 0xb) << 0x20 |
          (ulong)*(byte *)((long)__return_storage_ptr__ + 0xc) << 0x18 |
          (ulong)*(byte *)((long)__return_storage_ptr__ + 0xd) << 0x10 |
          (ulong)*(byte *)((long)__return_storage_ptr__ + 0xe) << 8 |
         (ulong)*(byte *)((long)__return_storage_ptr__ + 0xf));
}

Assistant:

constexpr __uint128_t uint128::bytes_to_uint128 (std::uint8_t const * const bytes) noexcept {
        return __uint128_t{bytes[0]} << 120U | __uint128_t{bytes[1]} << 112U |
               __uint128_t{bytes[2]} << 104U | __uint128_t{bytes[3]} << 96U |
               __uint128_t{bytes[4]} << 88U | __uint128_t{bytes[5]} << 80U |
               __uint128_t{bytes[6]} << 72U | __uint128_t{bytes[7]} << 64U |
               __uint128_t{bytes[8]} << 56U | __uint128_t{bytes[9]} << 48U |
               __uint128_t{bytes[10]} << 40U | __uint128_t{bytes[11]} << 32U |
               __uint128_t{bytes[12]} << 24U | __uint128_t{bytes[13]} << 16U |
               __uint128_t{bytes[14]} << 8U | __uint128_t{bytes[15]};
    }